

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deMemPool.c
# Opt level: O1

void * deMemPool_alignedAlloc(deMemPool *pool,size_t numBytes,deUint32 alignBytes)

{
  deMemPoolUtil *pdVar1;
  int iVar2;
  deUintptr val_1;
  MemPage *pMVar3;
  ulong uVar4;
  deUintptr val;
  MemPage *pMVar5;
  long lVar6;
  void *pvVar7;
  int iVar8;
  
  pMVar5 = pool->currentPage;
  iVar2 = pMVar5->bytesAllocated;
  uVar4 = (ulong)alignBytes;
  pvVar7 = (void *)((long)&pMVar5->nextPage + uVar4 + (long)iVar2 + 7 & -uVar4);
  lVar6 = (long)pvVar7 - ((long)&pMVar5[1].capacity + (long)iVar2);
  if ((ulong)(long)(pMVar5->capacity - iVar2) < numBytes + lVar6) {
    iVar2 = alignBytes - 4;
    if ((int)(alignBytes - 4) < 1) {
      iVar2 = 0;
    }
    iVar8 = pMVar5->capacity * 2;
    if (0x1f9f < iVar8) {
      iVar8 = 0x1fa0;
    }
    iVar2 = (int)numBytes + iVar2;
    if (iVar8 <= iVar2) {
      iVar8 = iVar2;
    }
    pMVar3 = (MemPage *)deMalloc((long)iVar8 + 0x10);
    pMVar5 = (MemPage *)0x0;
    if (pMVar3 != (MemPage *)0x0) {
      pMVar3->capacity = 0;
      pMVar3->bytesAllocated = 0;
      pMVar3->nextPage = (MemPage *)0x0;
      pMVar3->capacity = iVar8;
      pMVar5 = pMVar3;
    }
    if (pMVar5 == (MemPage *)0x0) {
      pvVar7 = (void *)0x0;
      goto LAB_00218231;
    }
    pMVar5->nextPage = pool->currentPage;
    pool->currentPage = pMVar5;
    pvVar7 = (void *)((long)&pMVar5->nextPage + uVar4 + 7 & -uVar4);
    lVar6 = (long)pvVar7 - (long)(pMVar5 + 1);
  }
  pMVar5->bytesAllocated = pMVar5->bytesAllocated + (int)lVar6 + (int)numBytes;
LAB_00218231:
  if ((pvVar7 == (void *)0x0) && (pdVar1 = pool->util, pdVar1 != (deMemPoolUtil *)0x0)) {
    (*pdVar1->allocFailCallback)(pdVar1->userPointer);
  }
  return pvVar7;
}

Assistant:

void* deMemPool_alignedAlloc (deMemPool* pool, size_t numBytes, deUint32 alignBytes)
{
	void* ptr;
	DE_ASSERT(pool);
	DE_ASSERT(numBytes > 0);
	DE_ASSERT(deIsPowerOfTwo32((int)alignBytes));
	ptr = deMemPool_allocInternal(pool, numBytes, alignBytes);
	DE_ASSERT(deIsAlignedPtr(ptr, alignBytes));
	if (!ptr && pool->util)
		pool->util->allocFailCallback(pool->util->userPointer);
	return ptr;
}